

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-chunk.c
# Opt level: O3

_Bool chunk_list_remove(char *name)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  chunk_conflict **ppcVar5;
  _Bool _Var6;
  
  ppcVar5 = chunk_list;
  uVar4 = (uint)chunk_list_max;
  if (uVar4 == 0) {
LAB_0014f7d6:
    _Var6 = false;
  }
  else {
    iVar1 = strcmp(name,(*chunk_list)->name);
    if (iVar1 == 0) {
      _Var6 = true;
      uVar3 = 1;
      uVar2 = 0;
    }
    else {
      uVar3 = 1;
      do {
        uVar2 = uVar3;
        if (uVar4 == uVar2) goto LAB_0014f7d6;
        uVar3 = uVar2 + 1;
        iVar1 = strcmp(name,ppcVar5[uVar2]->name);
      } while (iVar1 != 0);
      _Var6 = uVar2 < uVar4;
    }
    if ((int)uVar2 + 1U < uVar4) {
      do {
        chunk_list[uVar2] = chunk_list[uVar3];
        uVar3 = uVar3 + 1;
        uVar2 = uVar2 + 1;
        ppcVar5 = chunk_list;
      } while (uVar4 - 1 != uVar2);
    }
    chunk_list_max = (uint16_t)(uVar4 - 1);
    ppcVar5[uVar4 - 1 & 0xffff] = (chunk_conflict *)0x0;
  }
  return _Var6;
}

Assistant:

bool chunk_list_remove(const char *name)
{
	int i;

	/* Find the match */
	for (i = 0; i < chunk_list_max; i++) {
		if (streq(name, chunk_list[i]->name)) {
			/* Copy all the succeeding chunks back one */
			int j;
			for (j = i + 1; j < chunk_list_max; j++) {
				chunk_list[j - 1] = chunk_list[j];
			}

			/* Shorten the list and return */
			chunk_list_max--;
			chunk_list[chunk_list_max] = NULL;
			return true;
		}
	}

	return false;
}